

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O2

void ** fakeit::VirtualTable<IMessageHolder>::buildVTArray(void)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new__(0x30);
  puVar1[2] = 0;
  puVar1[3] = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[3] = &IMessageHolder::typeinfo;
  return (void **)(puVar1 + 4);
}

Assistant:

static void **buildVTArray() {
            int size = VTUtils::getVTSize<C>();
            auto array = new void *[size + 2 + numOfCookies]{};
            array += numOfCookies;
            array++;
            array[0] = const_cast<std::type_info *>(&typeid(C));
            array++;
            return array;
        }